

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.h
# Opt level: O2

double __thiscall embree::BVHNStatistics<4>::Statistics::sah(Statistics *this,BVH *bvh)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = LeafStat::sah(&this->statLeaf,bvh);
  dVar2 = NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_>::sah(&this->statAABBNodes,bvh);
  dVar3 = NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_>::sah(&this->statOBBNodes,bvh);
  dVar4 = NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_>::sah(&this->statAABBNodesMB,bvh)
  ;
  dVar5 = NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_>::sah
                    (&this->statAABBNodesMB4D,bvh);
  dVar6 = NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_>::sah(&this->statOBBNodesMB,bvh);
  dVar7 = NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_>::sah
                    (&this->statQuantizedNodes,bvh);
  return dVar7 + dVar6 + dVar5 + dVar4 + dVar3 + dVar2 + dVar1;
}

Assistant:

double sah(BVH* bvh) const 
      {
        return statLeaf.sah(bvh) +
          statAABBNodes.sah(bvh) + 
          statOBBNodes.sah(bvh) + 
          statAABBNodesMB.sah(bvh) + 
          statAABBNodesMB4D.sah(bvh) + 
          statOBBNodesMB.sah(bvh) + 
          statQuantizedNodes.sah(bvh);
      }